

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O1

bool __thiscall FScanner::GetToken(FScanner *this)

{
  char *__nptr;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  char *stopper;
  char *pcStack_18;
  
  bVar1 = ScanString(this,true);
  if (!bVar1) {
    return bVar1;
  }
  switch(this->TokenType) {
  case 0x102:
    iVar2 = strbin(this->String);
    this->StringLen = iVar2;
    break;
  case 0x103:
    iVar2 = FName::NameManager::FindName(&FName::NameData,this->String,false);
    (this->Name).Index = iVar2;
    break;
  case 0x104:
    __nptr = this->String;
    if (((byte)(__nptr[(long)this->StringLen + -1] | 0x20U) == 0x75) ||
       ((byte)(__nptr[(long)this->StringLen + -2] | 0x20U) == 0x75)) {
      this->TokenType = 0x105;
      uVar3 = strtoul(__nptr,&pcStack_18,0);
      this->Number = (int)uVar3;
      dVar5 = (double)(uVar3 & 0xffffffff);
    }
    else {
      lVar4 = strtol(__nptr,&pcStack_18,0);
      this->Number = (int)lVar4;
      dVar5 = (double)(int)lVar4;
    }
    goto LAB_0048869b;
  case 0x106:
    dVar5 = strtod(this->String,&pcStack_18);
LAB_0048869b:
    this->Float = dVar5;
  }
  return bVar1;
}

Assistant:

bool FScanner::GetToken ()
{
	if (ScanString (true))
	{
		if (TokenType == TK_NameConst)
		{
			Name = FName(String);
		}
		else if (TokenType == TK_IntConst)
		{
			char *stopper;
			// Check for unsigned
			if (String[StringLen - 1] == 'u' || String[StringLen - 1] == 'U' ||
				String[StringLen - 2] == 'u' || String[StringLen - 2] == 'U')
			{
				TokenType = TK_UIntConst;
				Number = strtoul(String, &stopper, 0);
				Float = (unsigned)Number;
			}
			else
			{
				Number = strtol(String, &stopper, 0);
				Float = Number;
			}
		}
		else if (TokenType == TK_FloatConst)
		{
			char *stopper;
			Float = strtod(String, &stopper);
		}
		else if (TokenType == TK_StringConst)
		{
			StringLen = strbin(String);
		}
		return true;
	}
	return false;
}